

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction.cc
# Opt level: O0

void __thiscall
sptk::PitchExtraction::PitchExtraction
          (PitchExtraction *this,int frame_shift,double sampling_rate,double lower_f0,
          double upper_f0,double voicing_threshold,Algorithms algorithm)

{
  PitchExtractionByRapt *this_00;
  void *pvVar1;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  int frame_shift_00;
  PitchExtractionBySwipe *in_stack_ffffffffffffffa0;
  
  frame_shift_00 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  *in_RDI = &PTR__PitchExtraction_001739d0;
  switch(in_EDX) {
  case 0:
    this_00 = (PitchExtractionByRapt *)operator_new(0x38);
    PitchExtractionByRapt::PitchExtractionByRapt
              (this_00,frame_shift_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI[1] = this_00;
    break;
  case 1:
    pvVar1 = operator_new(0x38);
    PitchExtractionBySwipe::PitchExtractionBySwipe
              (in_stack_ffffffffffffffa0,(int)((ulong)pvVar1 >> 0x20),in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI[1] = pvVar1;
    break;
  case 2:
    pvVar1 = operator_new(0x38);
    PitchExtractionByReaper::PitchExtractionByReaper
              ((PitchExtractionByReaper *)in_stack_ffffffffffffffa0,frame_shift_00,(double)pvVar1,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_RDI[1] = pvVar1;
    break;
  case 3:
    pvVar1 = operator_new(0x38);
    PitchExtractionByDio::PitchExtractionByDio
              ((PitchExtractionByDio *)in_stack_ffffffffffffffa0,frame_shift_00,
               in_stack_ffffffffffffff90,(double)pvVar1,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    in_RDI[1] = pvVar1;
    break;
  case 4:
    pvVar1 = operator_new(0x38);
    PitchExtractionByHarvest::PitchExtractionByHarvest
              ((PitchExtractionByHarvest *)in_stack_ffffffffffffffa0,frame_shift_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(double)pvVar1,
               in_stack_ffffffffffffff78);
    in_RDI[1] = pvVar1;
    break;
  default:
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

PitchExtraction::PitchExtraction(int frame_shift, double sampling_rate,
                                 double lower_f0, double upper_f0,
                                 double voicing_threshold,
                                 PitchExtraction::Algorithms algorithm) {
  switch (algorithm) {
    case kRapt: {
      pitch_extraction_ = new PitchExtractionByRapt(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kSwipe: {
      pitch_extraction_ = new PitchExtractionBySwipe(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kReaper: {
      pitch_extraction_ = new PitchExtractionByReaper(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kDio: {
      pitch_extraction_ = new PitchExtractionByDio(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    case kHarvest: {
      pitch_extraction_ = new PitchExtractionByHarvest(
          frame_shift, sampling_rate, lower_f0, upper_f0, voicing_threshold);
      break;
    }
    default: {
      pitch_extraction_ = NULL;
      break;
    }
  }
}